

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noisy_laser_tag.cpp
# Opt level: O2

Belief * __thiscall
despot::NoisyLaserTag::InitialBelief(NoisyLaserTag *this,State *start,string type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  StateIndexer *pSVar5;
  int iVar6;
  int opp;
  int iVar7;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  State *local_50;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_48;
  
  if (start == (State *)0x0) {
    __assert_fail("start != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/examples/cpp_models/tag/src/noisy_laser_tag/noisy_laser_tag.cpp"
                  ,0x97,
                  "virtual Belief *despot::NoisyLaserTag::InitialBelief(const State *, string) const"
                 );
  }
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = despot::Floor::NumCells();
  iVar4 = 0;
  iVar6 = 0;
  if (0 < iVar2) {
    iVar6 = iVar2;
  }
  for (; iVar4 != iVar6; iVar4 = iVar4 + 1) {
    for (iVar7 = 0; iVar2 != iVar7; iVar7 = iVar7 + 1) {
      iVar1 = (this->super_BaseTag).rob_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[*(int *)(start + 0xc)];
      iVar3 = despot::Floor::NumCells();
      local_50 = (State *)(**(code **)(*(long *)&this->super_BaseTag + 0xe0))
                                    ((1.0 / (double)iVar2) / (double)iVar2,this,
                                     iVar3 * iVar1 + iVar7);
      std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                ((vector<despot::State*,std::allocator<despot::State*>> *)&particles,&local_50);
    }
  }
  pSVar5 = (StateIndexer *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_48,&particles);
  despot::ParticleBelief::ParticleBelief
            ((ParticleBelief *)pSVar5,&local_48,&(this->super_BaseTag).super_BeliefMDP,0,1);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_48);
  despot::ParticleBelief::state_indexer(pSVar5);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
            (&particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
  return (Belief *)pSVar5;
}

Assistant:

Belief* NoisyLaserTag::InitialBelief(const State* start, string type) const {
	assert(start != NULL);

	vector<State*> particles;
	int N = floor_.NumCells();
	double wgt = 1.0 / N / N;
	for (int rob = 0; rob < N; rob++) {
		for (int opp = 0; opp < N; opp++) {
			TagState* state = static_cast<TagState*>(Allocate(
				RobOppIndicesToStateIndex(rob_[start->state_id], opp), wgt));
			particles.push_back(state);
		}
	}

	ParticleBelief* belief = new ParticleBelief(particles, this);
	belief->state_indexer(this);
	return belief;
}